

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
* __thiscall
pbrt::
Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
::operator=(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            *this,Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  *other)

{
  bool bVar1;
  int iVar2;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_> *pvVar3
  ;
  Bounds2<int> *in_RSI;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *in_RDI;
  int i_2;
  int no;
  int i_1;
  int n_1;
  int i;
  int n;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  int local_18;
  
  bVar1 = pstd::pmr::operator==
                    ((polymorphic_allocator<std::byte> *)in_RDI,
                     (polymorphic_allocator<std::byte> *)in_stack_ffffffffffffffc8);
  if (bVar1) {
    pstd::swap<pbrt::Bounds2<int>>(&in_RDI->extent,in_RSI);
    pstd::
    swap<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>*>
              (&in_RDI->values,
               (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                **)&in_RSI[1].pMax);
  }
  else {
    bVar1 = Bounds2<int>::operator==
                      ((Bounds2<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                       ,(Bounds2<int> *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::
        destroy<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>>
                  ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffc8);
        pstd::pmr::polymorphic_allocator<std::byte>::
        construct<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>,std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>&>
                  ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffc8,
                   (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                    *)0x3f832a);
      }
      (in_RDI->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (in_RSI->pMin).super_Tuple2<pbrt::Point2,_int>;
      (in_RDI->extent).pMax.super_Tuple2<pbrt::Point2,_int> =
           (in_RSI->pMax).super_Tuple2<pbrt::Point2,_int>;
    }
    else {
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::
        destroy<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>>
                  ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffc8);
      }
      pstd::pmr::polymorphic_allocator<std::byte>::
      deallocate_object<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>>
                ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffc8,0x3f83bc);
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      pvVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
               allocate_object<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>>
                         ((polymorphic_allocator<std::byte> *)in_RDI,
                          (size_t)in_stack_ffffffffffffffc8);
      in_RDI->values = pvVar3;
      for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::
        construct<std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>,std::vector<pbrt::VarianceEstimator<double>,std::allocator<pbrt::VarianceEstimator<double>>>&>
                  ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffc8,
                   (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                    *)0x3f8431);
      }
    }
  }
  return in_RDI;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }